

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEditPrivate::cursorPositionChanged(QPlainTextEditPrivate *this)

{
  QAccessibleTextCursorEvent *this_00;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QPlainTextEdit *q;
  QAccessibleTextCursorEvent ev;
  QTextCursor *this_01;
  QPlainTextEdit *in_stack_ffffffffffffffb8;
  QObject *obj;
  QTextCursor local_30 [8];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->field_0x348 = in_RDI->field_0x348 & 0xbf;
  this_00 = (QAccessibleTextCursorEvent *)q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = local_30;
  QPlainTextEdit::textCursor(in_stack_ffffffffffffffb8);
  QTextCursor::position();
  obj = (QObject *)&local_28;
  QAccessibleTextCursorEvent::QAccessibleTextCursorEvent(this_00,obj,(int)((ulong)this_01 >> 0x20));
  QTextCursor::~QTextCursor(this_01);
  QAccessible::updateAccessibility((QAccessibleEvent *)obj);
  QPlainTextEdit::cursorPositionChanged((QPlainTextEdit *)0x6bf1b5);
  QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent((QAccessibleTextCursorEvent *)obj);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::cursorPositionChanged()
{
    pageUpDownLastCursorYIsValid = false;
    Q_Q(QPlainTextEdit);
#if QT_CONFIG(accessibility)
    QAccessibleTextCursorEvent ev(q, q->textCursor().position());
    QAccessible::updateAccessibility(&ev);
#endif
    emit q->cursorPositionChanged();
}